

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

UBool __thiscall icu_63::RuleBasedCollator::operator==(RuleBasedCollator *this,Collator *other)

{
  CollationData *pCVar1;
  CollationData *pCVar2;
  _func_int **pp_Var3;
  UBool UVar4;
  int iVar5;
  undefined4 extraout_var;
  UnicodeSet *o;
  UnicodeSet *p;
  bool bVar6;
  UErrorCode errorCode;
  LocalPointer<icu_63::UnicodeSet> otherTailored;
  LocalPointer<icu_63::UnicodeSet> thisTailored;
  int local_2c;
  UnicodeSet *local_28;
  UnicodeSet *local_20;
  UnicodeSet *this_00;
  undefined4 extraout_var_00;
  
  if (this == (RuleBasedCollator *)other) {
    return '\x01';
  }
  UVar4 = Collator::operator==(&this->super_Collator,other);
  if ((UVar4 != '\0') &&
     (UVar4 = CollationSettings::operator==
                        (this->settings,(CollationSettings *)other[2].super_UObject._vptr_UObject),
     UVar4 != '\0')) {
    pCVar1 = (CollationData *)other[1].super_UObject._vptr_UObject;
    if (this->data == pCVar1) {
      return '\x01';
    }
    pCVar2 = this->data->base;
    pCVar1 = pCVar1->base;
    if ((pCVar1 == (CollationData *)0x0) == (pCVar2 == (CollationData *)0x0)) {
      if ((((pCVar2 == (CollationData *)0x0) ||
           (0x1f < (ushort)(this->tailoring->rules).fUnion.fStackFields.fLengthAndFlags)) &&
          ((pp_Var3 = other[3].super_UObject._vptr_UObject, pCVar1 == (CollationData *)0x0 ||
           (0x1f < *(ushort *)(pp_Var3 + 6))))) &&
         (UVar4 = UnicodeString::operator==(&this->tailoring->rules,(UnicodeString *)(pp_Var3 + 5)),
         UVar4 != '\0')) {
        return '\x01';
      }
      p = (UnicodeSet *)&stack0xffffffffffffffd4;
      local_2c = 0;
      iVar5 = (*(this->super_Collator).super_UObject._vptr_UObject[0x1f])(this,p);
      this_00 = (UnicodeSet *)CONCAT44(extraout_var,iVar5);
      local_20 = this_00;
      iVar5 = (*(other->super_UObject)._vptr_UObject[0x1f])(other);
      o = (UnicodeSet *)CONCAT44(extraout_var_00,iVar5);
      local_28 = o;
      if (local_2c < 1) {
        p = o;
        UVar4 = UnicodeSet::operator==(this_00,o);
        bVar6 = UVar4 != '\0';
      }
      else {
        bVar6 = false;
      }
      if (o != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet(o);
      }
      UMemory::operator_delete((UMemory *)o,p);
      if (this_00 != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet(this_00);
      }
      UMemory::operator_delete((UMemory *)this_00,p);
      return bVar6;
    }
  }
  return '\0';
}

Assistant:

UBool
RuleBasedCollator::operator==(const Collator& other) const {
    if(this == &other) { return TRUE; }
    if(!Collator::operator==(other)) { return FALSE; }
    const RuleBasedCollator &o = static_cast<const RuleBasedCollator &>(other);
    if(*settings != *o.settings) { return FALSE; }
    if(data == o.data) { return TRUE; }
    UBool thisIsRoot = data->base == NULL;
    UBool otherIsRoot = o.data->base == NULL;
    U_ASSERT(!thisIsRoot || !otherIsRoot);  // otherwise their data pointers should be ==
    if(thisIsRoot != otherIsRoot) { return FALSE; }
    if((thisIsRoot || !tailoring->rules.isEmpty()) &&
            (otherIsRoot || !o.tailoring->rules.isEmpty())) {
        // Shortcut: If both collators have valid rule strings, then compare those.
        if(tailoring->rules == o.tailoring->rules) { return TRUE; }
    }
    // Different rule strings can result in the same or equivalent tailoring.
    // The rule strings are optional in ICU resource bundles, although included by default.
    // cloneBinary() drops the rule string.
    UErrorCode errorCode = U_ZERO_ERROR;
    LocalPointer<UnicodeSet> thisTailored(getTailoredSet(errorCode));
    LocalPointer<UnicodeSet> otherTailored(o.getTailoredSet(errorCode));
    if(U_FAILURE(errorCode)) { return FALSE; }
    if(*thisTailored != *otherTailored) { return FALSE; }
    // For completeness, we should compare all of the mappings;
    // or we should create a list of strings, sort it with one collator,
    // and check if both collators compare adjacent strings the same
    // (order & strength, down to quaternary); or similar.
    // Testing equality of collators seems unusual.
    return TRUE;
}